

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::SSBOLayoutCase::checkLayoutIndices(SSBOLayoutCase *this,BufferLayout *layout)

{
  ostringstream *poVar1;
  pointer pBVar2;
  ostringstream *poVar3;
  int iVar4;
  TestLog *pTVar5;
  pointer pBVar6;
  pointer pBVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  MessageBuilder *this_00;
  int iVar11;
  ulong uVar12;
  int *value;
  long lVar13;
  int iVar14;
  MessageBuilder local_1b0;
  
  pTVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  uVar9 = ((long)(layout->bufferVars).
                 super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(layout->bufferVars).
                super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x48;
  uVar12 = (ulong)((long)(layout->blocks).
                         super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(layout->blocks).
                        super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 6;
  poVar3 = &local_1b0.m_str;
  lVar13 = 0;
  iVar14 = (int)uVar9;
  uVar10 = 0;
  if (0 < iVar14) {
    uVar10 = uVar9 & 0xffffffff;
  }
  bVar8 = true;
  for (; iVar11 = (int)uVar12, uVar10 * 0x48 - lVar13 != 0; lVar13 = lVar13 + 0x48) {
    pBVar6 = (layout->bufferVars).
             super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = *(int *)((long)&pBVar6->blockNdx + lVar13);
    if ((iVar4 < 0) || (iVar11 <= iVar4)) {
      local_1b0.m_log = pTVar5;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar3);
      std::operator<<((ostream *)poVar3,"Error: Invalid block index in buffer variable \'");
      std::operator<<((ostream *)poVar3,(string *)((long)&(pBVar6->name)._M_dataplus._M_p + lVar13))
      ;
      std::operator<<((ostream *)poVar3,"\'");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
      bVar8 = false;
    }
  }
  poVar3 = &local_1b0.m_str;
  uVar10 = 0;
  uVar9 = uVar12 & 0xffffffff;
  if (iVar11 < 1) {
    uVar9 = uVar10;
  }
  for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
    pBVar7 = (layout->blocks).
             super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = pBVar7 + uVar10;
    for (value = *(int **)&pBVar7[uVar10].activeVarIndices.
                           super__Vector_base<int,_std::allocator<int>_>;
        value != *(pointer *)
                  ((long)&(pBVar2->activeVarIndices).super__Vector_base<int,_std::allocator<int>_> +
                  8); value = value + 1) {
      if ((*value < 0) || (iVar14 <= *value)) {
        local_1b0.m_log = pTVar5;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar3);
        std::operator<<((ostream *)poVar3,"Error: Invalid active variable index ");
        this_00 = tcu::MessageBuilder::operator<<(&local_1b0,value);
        poVar1 = &this_00->m_str;
        std::operator<<((ostream *)poVar1," in block \'");
        std::operator<<((ostream *)poVar1,(string *)pBVar2);
        std::operator<<((ostream *)poVar1,"\'");
        tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
        bVar8 = false;
      }
    }
  }
  return bVar8;
}

Assistant:

bool SSBOLayoutCase::checkLayoutIndices (const BufferLayout& layout) const
{
	TestLog&	log			= m_testCtx.getLog();
	int			numVars		= (int)layout.bufferVars.size();
	int			numBlocks	= (int)layout.blocks.size();
	bool		isOk		= true;

	// Check variable block indices.
	for (int varNdx = 0; varNdx < numVars; varNdx++)
	{
		const BufferVarLayoutEntry& bufVar = layout.bufferVars[varNdx];

		if (bufVar.blockNdx < 0 || !deInBounds32(bufVar.blockNdx, 0, numBlocks))
		{
			log << TestLog::Message << "Error: Invalid block index in buffer variable '" << bufVar.name << "'" << TestLog::EndMessage;
			isOk = false;
		}
	}

	// Check active variables.
	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const BlockLayoutEntry& block = layout.blocks[blockNdx];

		for (vector<int>::const_iterator varNdxIter = block.activeVarIndices.begin(); varNdxIter != block.activeVarIndices.end(); varNdxIter++)
		{
			if (!deInBounds32(*varNdxIter, 0, numVars))
			{
				log << TestLog::Message << "Error: Invalid active variable index " << *varNdxIter << " in block '" << block.name << "'" << TestLog::EndMessage;
				isOk = false;
			}
		}
	}

	return isOk;
}